

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardVariable.cpp
# Opt level: O2

StdVarPtr *
KDIS::DATA_TYPE::StandardVariable::FactoryDecodeStandardVariable
          (StdVarPtr *__return_storage_ptr__,KDataStream *stream)

{
  KUINT16 KVar1;
  IOCommunicationsNode *this;
  ostream *poVar2;
  KException *pKVar3;
  allocator<char> local_1f9;
  StandardVariable recordHeader;
  KString local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  KStringStream ss;
  ostream local_198 [376];
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 6) {
    pKVar3 = (KException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"FactoryDecodeStandardVariable",(allocator<char> *)&local_1e8);
    KException::KException(pKVar3,(KString *)&ss,2);
    __cxa_throw(pKVar3,&KException::typeinfo,KException::~KException);
  }
  KVar1 = KDataStream::GetCurrentWritePosition(stream);
  StandardVariable(&recordHeader,stream);
  KDataStream::SetCurrentWritePosition(stream,KVar1);
  this = (IOCommunicationsNode *)
         FactoryDecoderUser<KDIS::DATA_TYPE::StandardVariable>::FactoryDecode
                   (recordHeader.m_ui32Type,stream);
  if (this == (IOCommunicationsNode *)0x0) {
    if (recordHeader.m_ui32Type == 0x157c) {
      this = (IOCommunicationsNode *)operator_new(0x18);
      IOEffect::IOEffect((IOEffect *)this,stream);
    }
    else {
      if (recordHeader.m_ui32Type != 0x157d) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar2 = std::operator<<(local_198,"Unsupported StandardVariable type(");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,recordHeader.m_ui32Type);
        std::operator<<(poVar2,").");
        pKVar3 = (KException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"FactoryDecodeStandardVariable",&local_1f9);
        std::__cxx11::stringbuf::str();
        KException::KException<std::__cxx11::string>(pKVar3,&local_1e8,9,&local_1c8);
        __cxa_throw(pKVar3,&KException::typeinfo,KException::~KException);
      }
      this = (IOCommunicationsNode *)operator_new(0x20);
      IOCommunicationsNode::IOCommunicationsNode(this,stream);
    }
  }
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::KRef_Ptr
            (__return_storage_ptr__,&this->super_StandardVariable);
  DataTypeBase::~DataTypeBase(&recordHeader.super_DataTypeBase);
  return __return_storage_ptr__;
}

Assistant:

StdVarPtr StandardVariable::FactoryDecodeStandardVariable(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < STANDARD_VARIABLE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    // We want to peek at the next data and then roll back for a full decode.
    KUINT16 savePos = stream.GetCurrentWritePosition();

    // First decode the header so we can determine what type of record we are dealing with.
    StandardVariable recordHeader( stream );

    // Reset stream
    stream.SetCurrentWritePosition( savePos );

	// First check for a custom decoder.
	StandardVariable * p = FactoryDecode( recordHeader.GetStandardVariableType(), stream );

	if( p )
	{
		return StdVarPtr( p );
	}

	// Check for a KDIS implementation of the type.
    switch( recordHeader.GetStandardVariableType() )
    {
		case IOCommunicationsNodeRecord   : return new IOCommunicationsNode( stream );
		case IOEffectRecord               : return new IOEffect( stream );

		// TODO: DE Records
		//case DEPrecisionAimpointRecord        : return new IOEffect( stream );
		//case DEAreaAimpointRecord             : return new IOEffect( stream );
    }

    /*****************************************************************

    We could choose to ignore the record. To do so uncomment the following
    and comment out the exception throwing.

    // Move the buffer to the next readable data.
    stream.SetCurrentWritePosition( ui16SavePos + recordHeader.GetRecordLength() );
    return 0; // make sure the null ptr is handled.

    *****************************************************************/

    // We could not decode the StandardVariable child class. We will treat this as an error.	
	KStringStream ss;
	ss << "Unsupported StandardVariable type(" << recordHeader.GetStandardVariableType() << ").";
	throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, ss.str() );
}